

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

msgpack_unpack_return unpacker_next(msgpack_unpacker *mpac,msgpack_unpacked *result)

{
  void *pvVar1;
  msgpack_object *pmVar2;
  uint64_t uVar3;
  msgpack_unpack_return mVar4;
  msgpack_zone *pmVar5;
  
  msgpack_unpacked_destroy(result);
  mVar4 = msgpack_unpacker_execute(mpac);
  if (mVar4 < MSGPACK_UNPACK_CONTINUE) {
    (result->data).via.u64 = 0;
    (result->data).via.array.ptr = (msgpack_object *)0x0;
    result->zone = (msgpack_zone *)0x0;
    *(undefined8 *)&result->data = 0;
  }
  else if (mVar4 == MSGPACK_UNPACK_CONTINUE) {
    mVar4 = MSGPACK_UNPACK_CONTINUE;
  }
  else {
    pmVar5 = msgpack_unpacker_release_zone(mpac);
    result->zone = pmVar5;
    pvVar1 = mpac->ctx;
    pmVar2 = *(msgpack_object **)((long)pvVar1 + 0x30);
    uVar3 = *(uint64_t *)((long)pvVar1 + 0x28);
    *(undefined8 *)&result->data = *(undefined8 *)((long)pvVar1 + 0x20);
    (result->data).via.u64 = uVar3;
    (result->data).via.array.ptr = pmVar2;
    mVar4 = MSGPACK_UNPACK_SUCCESS;
  }
  return mVar4;
}

Assistant:

static inline msgpack_unpack_return unpacker_next(msgpack_unpacker* mpac,
                                                  msgpack_unpacked* result)
{
    int ret;

    msgpack_unpacked_destroy(result);

    ret = msgpack_unpacker_execute(mpac);

    if(ret < 0) {
        result->zone = NULL;
        memset(&result->data, 0, sizeof(msgpack_object));
        return ret;
    }

    if(ret == 0) {
        return MSGPACK_UNPACK_CONTINUE;
    }
    result->zone = msgpack_unpacker_release_zone(mpac);
    result->data = msgpack_unpacker_data(mpac);

    return MSGPACK_UNPACK_SUCCESS;
}